

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send.c
# Opt level: O2

yrmcds_error
yrmcds_incr(yrmcds *c,char *key,size_t key_len,uint64_t value,int quiet,uint32_t *serial)

{
  yrmcds_error yVar1;
  char extras [20];
  undefined4 uStack_4;
  
  if (key_len == 0 || (key == (char *)0x0 || c == (yrmcds *)0x0)) {
    return YRMCDS_BAD_ARGUMENT;
  }
  if (c->text_mode != 0) {
    yVar1 = yrmcds_text_incr(c,key,key_len,value,quiet,serial);
    return yVar1;
  }
  extras._0_8_ = value >> 0x38 | (value & 0xff000000000000) >> 0x28 |
                 (value & 0xff0000000000) >> 0x18 | (value & 0xff00000000) >> 8 |
                 (value & 0xff000000) << 8 | (value & 0xff0000) << 0x18 | (value & 0xff00) << 0x28 |
                 value << 0x38;
  extras[8] = '\0';
  extras[9] = '\0';
  extras[10] = '\0';
  extras[0xb] = '\0';
  extras[0xc] = '\0';
  extras[0xd] = '\0';
  extras[0xe] = '\0';
  extras[0xf] = '\0';
  stack0xfffffffffffffff8 = CONCAT44(uStack_4,0xffffffff);
  yVar1 = send_command(c,(uint)(quiet != 0) << 4 | YRMCDS_CMD_INCREMENT,0,serial,key_len,key,0x14,
                       extras,0,(char *)0x0);
  return yVar1;
}

Assistant:

yrmcds_error yrmcds_incr(yrmcds* c, const char* key, size_t key_len,
                         uint64_t value, int quiet, uint32_t* serial) {
    if( c == NULL || key == NULL || key_len == 0 )
        return YRMCDS_BAD_ARGUMENT;

    if( c->text_mode )
        return yrmcds_text_incr(c, key, key_len, value, quiet, serial);

    char extras[20];
    hton64(value, extras);
    hton64((uint64_t)0, &extras[8]);
    hton32(~(uint32_t)0, &extras[16]);
    return send_command(c, quiet ? YRMCDS_CMD_INCREMENTQ : YRMCDS_CMD_INCREMENT,
                        0, serial, key_len, key,
                        sizeof(extras), extras, 0, NULL);
}